

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O1

QPDFObjectHandle __thiscall
QPDFObjectHandle::parse
          (QPDFObjectHandle *this,QPDF *context,string *object_str,string *object_description)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  pointer pcVar3;
  int iVar4;
  ulong i;
  QPDFExc *this_00;
  qpdf_offset_t offset;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  type ii;
  QPDFObjectHandle QVar5;
  Buffer buf;
  BufferInputSource input;
  Buffer local_160;
  string local_158;
  string local_138;
  BufferInputSource local_118;
  
  Buffer::Buffer(&local_160,object_str);
  paVar1 = &local_158.field_2;
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"parsed object","");
  BufferInputSource::BufferInputSource(&local_118,&local_158,&local_160,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  QPDFParser::parse((QPDFParser *)this,&local_118.super_InputSource,object_description,context);
  i = BufferInputSource::tell(&local_118);
  if ((long)i < 0) {
    QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(i);
  }
  uVar2 = object_str->_M_string_length;
  if (i < uVar2) {
    pcVar3 = (object_str->_M_dataplus)._M_p;
    do {
      iVar4 = isspace((int)pcVar3[i]);
      if (iVar4 == 0) {
        this_00 = (QPDFExc *)__cxa_allocate_exception(0x80);
        local_158._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"parsed object","");
        offset = InputSource::getLastOffset(&local_118.super_InputSource);
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_138,"trailing data found parsing object from string","");
        QPDFExc::QPDFExc(this_00,qpdf_e_damaged_pdf,&local_158,object_description,offset,&local_138)
        ;
        __cxa_throw(this_00,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
      }
      i = i + 1;
    } while (uVar2 != i);
  }
  BufferInputSource::~BufferInputSource(&local_118);
  Buffer::~Buffer(&local_160);
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFObjectHandle::parse(
    QPDF* context, std::string const& object_str, std::string const& object_description)
{
    // BufferInputSource does not modify the input, but Buffer either requires a string& or copies
    // the string.
    Buffer buf(const_cast<std::string&>(object_str));
    auto input = BufferInputSource("parsed object", &buf);
    auto result = QPDFParser::parse(input, object_description, context);
    size_t offset = QIntC::to_size(input.tell());
    while (offset < object_str.length()) {
        if (!isspace(object_str.at(offset))) {
            QTC::TC("qpdf", "QPDFObjectHandle trailing data in parse");
            throw QPDFExc(
                qpdf_e_damaged_pdf,
                "parsed object",
                object_description,
                input.getLastOffset(),
                "trailing data found parsing object from string");
        }
        ++offset;
    }
    return result;
}